

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O3

int compress_deflate(Byte *out,uint *outlen,Byte *in,uint inlen)

{
  int iVar1;
  int iVar2;
  Byte *local_80;
  uint local_78;
  Byte *local_68;
  uint local_60;
  uint local_58;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  local_60 = *outlen;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0;
  local_80 = in;
  local_78 = inlen;
  local_68 = out;
  iVar1 = deflateInit2_(&local_80,9,8,0xfffffff1,9,0,"1.2.11",0x70);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = deflate(&local_80,4);
    if (iVar1 == 1) {
      *outlen = local_58;
      iVar2 = deflateEnd();
      iVar2 = -(uint)(iVar2 != 0);
    }
    else {
      deflateEnd();
    }
  }
  return iVar2;
}

Assistant:

int compress_deflate(Byte *out, unsigned int *outlen, const Byte *in, unsigned int inlen)
{
    z_stream stream;
    int err;

    stream.next_in = (Bytef *)in;
    stream.avail_in = inlen;
    stream.next_out = out;
    stream.avail_out = *outlen;
    stream.zalloc = (alloc_func)0;
    stream.zfree = (free_func)0;
    stream.opaque = (voidpf)0;

    err = deflateInit2(&stream, 9, Z_DEFLATED, -15, 9, Z_DEFAULT_STRATEGY);
    if (err != Z_OK) return -1;

    err = deflate(&stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        deflateEnd(&stream);
        return -1;
    }
    *outlen = stream.total_out;

    err = deflateEnd(&stream);
	return err == Z_OK ? 0 : -1;
}